

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  ImGuiNavLayer nav_layer;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 fill_col;
  byte bVar5;
  undefined7 in_register_00000031;
  ImGuiCol idx;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool hovered;
  bool held;
  ImVec2 label_size;
  bool local_96;
  bool local_95;
  ImGuiID local_94;
  float local_90;
  undefined4 local_8c;
  ImRect local_88;
  undefined1 local_78 [16];
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_8c = (undefined4)CONCAT71(in_register_00000031,selected);
    local_94 = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_58 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar9 = (*size_arg).x;
    fVar10 = (*size_arg).y;
    uVar7 = -(uint)(fVar9 != 0.0);
    uVar8 = -(uint)(fVar10 != 0.0);
    local_60.x = (float)(~uVar7 & (uint)local_58.x | (uint)fVar9 & uVar7);
    local_60.y = (float)(~uVar8 & (uint)local_58.y | (uint)fVar10 & uVar8);
    local_90 = (this->DC).CursorPos.x;
    local_78 = ZEXT416((uint)((this->DC).CursorPos.y + (this->DC).CurrLineTextBaseOffset));
    ItemSize(&local_60,0.0);
    local_88.Min.x = local_90;
    if ((flags & 2U) != 0) {
      local_88.Min.x = (this->ParentWorkRect).Min.x;
    }
    if ((((uint)flags >> 0x18 & 1) != 0) || ((size_arg->x == 0.0 && (!NAN(size_arg->x))))) {
      fVar9 = (&(this->WorkRect).Max)[flags & 2].x - local_88.Min.x;
      uVar7 = -(uint)(fVar9 <= local_58.x);
      local_60.x = (float)(uVar7 & (uint)local_58.x | ~uVar7 & (uint)fVar9);
    }
    local_50.x = local_90;
    local_50.y = (float)local_78._0_4_;
    local_48.x = local_60.x + local_88.Min.x;
    local_48.y = local_60.y + (float)local_78._0_4_;
    local_88.Min.y = (float)local_78._0_4_;
    local_88.Max = local_48;
    if (((uint)flags >> 0x1b & 1) == 0) {
      fVar9 = 0.0;
      if ((flags & 2U) == 0) {
        fVar9 = (pIVar3->Style).ItemSpacing.x;
      }
      fVar10 = (pIVar3->Style).ItemSpacing.y;
      fVar11 = (float)(int)(fVar10 * 0.5);
      local_88.Min.x = local_88.Min.x - (float)(int)(fVar9 * 0.5);
      local_88.Min.y = (float)local_78._0_4_ - fVar11;
      local_88.Max.y = local_48.y + (fVar10 - fVar11);
      local_88.Max.x = local_48.x + (fVar9 - (float)(int)(fVar9 * 0.5));
    }
    local_78._0_4_ = (this->ClipRect).Min.x;
    local_90 = (this->ClipRect).Max.x;
    if ((flags & 2U) != 0) {
      fVar9 = (this->ParentWorkRect).Max.x;
      (this->ClipRect).Min.x = (this->ParentWorkRect).Min.x;
      (this->ClipRect).Max.x = fVar9;
    }
    bVar4 = ItemAdd(&local_88,local_94,(ImRect *)0x0,(flags & 8U) >> 1);
    if ((flags & 2U) != 0) {
      (this->ClipRect).Min.x = (float)local_78._0_4_;
      (this->ClipRect).Max.x = local_90;
    }
    if (bVar4) {
      bVar5 = (byte)((pIVar3->CurrentItemFlags & 4U) >> 2) | (flags & 8U) == 0;
      local_90 = (float)(uint)bVar5;
      if (bVar5 == 0) {
        BeginDisabled(true);
      }
      if ((flags & 2U) != 0) {
        if ((this->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
          if (pIVar3->CurrentTable != (ImGuiTable *)0x0) {
            TablePushBackgroundChannel();
          }
        }
        else {
          PushColumnsBackground();
        }
      }
      local_78._0_8_ = label;
      uVar8 = (uint)flags >> 0x10 & 0x80;
      uVar7 = uVar8 + 0x120;
      if ((flags & 4U) == 0) {
        uVar7 = uVar8;
      }
      bVar4 = ButtonBehavior(&local_88,local_94,&local_96,&local_95,
                             (flags & 0x10U) << 8 |
                             uVar7 + ((uint)flags >> 0x12 & 0x10 | (uint)flags >> 3 & 0x20000));
      bVar5 = (byte)local_8c;
      if ((((uint)flags >> 0x15 & 1) != 0) && (pIVar3->NavJustMovedToId != 0)) {
        bVar6 = pIVar3->NavJustMovedToId == local_94 &&
                pIVar3->NavJustMovedToFocusScopeId == (this->DC).NavFocusScopeIdCurrent;
        bVar4 = bVar4 || bVar6;
        bVar5 = bVar6 | bVar5;
      }
      if (((bVar4 != false) || ((((uint)flags >> 0x1a & 1) != 0 && (local_96 != false)))) &&
         ((pIVar3->NavDisableMouseHover == false &&
          ((pIVar3->NavWindow == this &&
           (nav_layer = (this->DC).NavLayerCurrent, pIVar3->NavLayer == nav_layer)))))) {
        IVar2 = (this->DC).CursorStartPos;
        local_40.Max.x = IVar2.x;
        local_40.Max.y = IVar2.y;
        local_40.Min.x = local_88.Min.x - local_40.Max.x;
        local_40.Min.y = local_88.Min.y - local_40.Max.y;
        local_40.Max.x = local_88.Max.x - local_40.Max.x;
        local_40.Max.y = local_88.Max.y - local_40.Max.y;
        SetNavID(local_94,nav_layer,(this->DC).NavFocusScopeIdCurrent,&local_40);
        pIVar3->NavDisableHighlight = true;
      }
      if (bVar4 != false) {
        MarkItemEdited(local_94);
      }
      if ((flags & 0x10U) != 0) {
        SetItemAllowOverlap();
      }
      if (bVar5 != (byte)local_8c) {
        pIVar1 = &(pIVar3->LastItemData).StatusFlags;
        *(byte *)pIVar1 = (byte)*pIVar1 | 8;
      }
      if (((uint)flags >> 0x19 & 1) != 0 && local_95 == true) {
        local_96 = true;
      }
      if ((bVar5 | local_96) == 1) {
        idx = 0x18;
        if (local_96 != false) {
          idx = local_95 + 0x19;
        }
        fill_col = GetColorU32(idx,1.0);
        IVar2.y = local_88.Min.y;
        IVar2.x = local_88.Min.x;
        RenderFrame(IVar2,local_88.Max,fill_col,false,0.0);
      }
      RenderNavHighlight(&local_88,local_94,10);
      if ((flags & 2U) != 0) {
        if ((this->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
          if (pIVar3->CurrentTable != (ImGuiTable *)0x0) {
            TablePopBackgroundChannel();
          }
        }
        else {
          PopColumnsBackground();
        }
      }
      RenderTextClipped(&local_50,&local_48,(char *)local_78._0_8_,(char *)0x0,&local_58,
                        &(pIVar3->Style).SelectableTextAlign,&local_88);
      if ((((bVar4 != false) && ((flags & 1U) == 0)) && ((this->Flags & 0x4000000U) != 0)) &&
         (((pIVar3->LastItemData).InFlags & 0x20) == 0)) {
        CloseCurrentPopup();
      }
      if (local_90._0_1_ != '\0') {
        return bVar4;
      }
      EndDisabled();
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}